

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheGL.hpp
# Opt level: O1

void __thiscall
Diligent::ShaderResourceCacheGL::SetUniformBuffer
          (ShaderResourceCacheGL *this,Uint32 CacheOffset,
          RefCntAutoPtr<Diligent::BufferGLImpl> *pBuff,Uint64 BaseOffset,Uint64 RangeSize)

{
  BufferGLImpl *pBVar1;
  uint uVar2;
  CachedUB *this_00;
  ulong uVar3;
  BufferGLImpl *pObj;
  string msg;
  Uint64 local_58;
  Uint64 local_50;
  string local_48;
  
  if (pBuff->m_pObject == (BufferGLImpl *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (pBuff->m_pObject->super_BufferBase<Diligent::EngineGLImplTraits>).
            super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
            .m_Desc.Size;
  }
  local_58 = RangeSize;
  local_50 = BaseOffset;
  if (uVar3 < RangeSize + BaseOffset) {
    FormatString<char[34]>(&local_48,(char (*) [34])"The range is out of buffer bounds");
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"SetUniformBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderResourceCacheGL.hpp"
               ,0x97);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if ((pBuff->m_pObject != (BufferGLImpl *)0x0) && (local_58 == 0)) {
    local_58 = (pBuff->m_pObject->super_BufferBase<Diligent::EngineGLImplTraits>).
               super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
               .m_Desc.Size - local_50;
  }
  this_00 = GetConstUB(this,CacheOffset);
  pBVar1 = pBuff->m_pObject;
  if ((this_00->pBuffer).m_pObject != pBVar1) {
    pBuff->m_pObject = (BufferGLImpl *)0x0;
    RefCntAutoPtr<Diligent::BufferGLImpl>::Release(&this_00->pBuffer);
    (this_00->pBuffer).m_pObject = pBVar1;
  }
  uVar2 = StaticCast<unsigned_int,unsigned_long>(&local_50);
  this_00->BaseOffset = uVar2;
  uVar2 = StaticCast<unsigned_int,unsigned_long>(&local_58);
  uVar3 = 1L << ((byte)CacheOffset & 0x3f);
  this_00->RangeSize = uVar2;
  this_00->DynamicOffset = 0;
  if ((this->m_DynamicUBOSlotMask >> ((ulong)CacheOffset & 0x3f) & 1) == 0) {
    if ((this->m_DynamicUBOMask & uVar3) != 0) {
      FormatString<char[94]>
                (&local_48,
                 (char (*) [94])
                 "Dynamic UBO bit should never be set when corresponding bit in m_DynamicUBOSlotMask is not set"
                );
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"SetUniformBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderResourceCacheGL.hpp"
                 ,0xb1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    pBVar1 = (this_00->pBuffer).m_pObject;
    if ((pBVar1 == (BufferGLImpl *)0x0) ||
       ((pBVar1->super_BufferBase<Diligent::EngineGLImplTraits>).
        super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
        .m_Desc.Size <= (ulong)uVar2)) {
      this->m_DynamicUBOMask = this->m_DynamicUBOMask & ~uVar3;
    }
    else {
      this->m_DynamicUBOMask = this->m_DynamicUBOMask | uVar3;
    }
  }
  LOCK();
  (this->super_ShaderResourceCacheBase).m_DvpRevision.super___atomic_base<unsigned_int>._M_i =
       (this->super_ShaderResourceCacheBase).m_DvpRevision.super___atomic_base<unsigned_int>._M_i +
       1;
  UNLOCK();
  return;
}

Assistant:

void SetUniformBuffer(Uint32 CacheOffset, RefCntAutoPtr<BufferGLImpl>&& pBuff, Uint64 BaseOffset, Uint64 RangeSize)
    {
        DEV_CHECK_ERR(BaseOffset + RangeSize <= (pBuff ? pBuff->GetDesc().Size : 0), "The range is out of buffer bounds");
        if (pBuff)
        {
            if (RangeSize == 0)
                RangeSize = pBuff->GetDesc().Size - BaseOffset;
        }

        auto& UB = GetUB(CacheOffset);

        UB.pBuffer       = std::move(pBuff);
        UB.BaseOffset    = StaticCast<Uint32>(BaseOffset);
        UB.RangeSize     = StaticCast<Uint32>(RangeSize);
        UB.DynamicOffset = 0;

        Uint64 UBBit = Uint64{1} << Uint64{CacheOffset};
        if (m_DynamicUBOSlotMask & UBBit)
        {
            // Only set the flag for those slots that allow dynamic buffers
            // (i.e. the variable was not created with NO_DYNAMIC_BUFFERS flag).
            if (UB.IsDynamic())
                m_DynamicUBOMask |= UBBit;
            else
                m_DynamicUBOMask &= ~UBBit;
        }
        else
        {
            VERIFY((m_DynamicUBOMask & UBBit) == 0, "Dynamic UBO bit should never be set when corresponding bit in m_DynamicUBOSlotMask is not set");
        }
        UpdateRevision();
    }